

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

int __thiscall QtPrivate::QCalendarModel::columnForDayOfWeek(QCalendarModel *this,DayOfWeek day)

{
  int column;
  DayOfWeek day_local;
  QCalendarModel *this_local;
  int local_4;
  
  if (((int)day < 1) || (Sunday < day)) {
    local_4 = -1;
  }
  else {
    column = day - this->m_firstDay;
    if (column < 0) {
      column = column + 7;
    }
    local_4 = column + this->m_firstColumn;
  }
  return local_4;
}

Assistant:

int QCalendarModel::columnForDayOfWeek(Qt::DayOfWeek day) const
{
    if (day < 1 || unsigned(day) > unsigned(7))
        return -1;
    int column = (int)day - (int)m_firstDay;
    if (column < 0)
        column += 7;
    return column + m_firstColumn;
}